

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_b16c(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  if (in->a < 1) {
    iVar1 = back->ig;
    out->r = back->ir;
    out->g = iVar1;
    uVar3 = back->ib;
  }
  else {
    dVar4 = (double)in->a / 65535.0;
    dVar5 = 1.0 - dVar4;
    dVar4 = dVar4 / 65535.0;
    bVar2 = sRGB((double)in->r * dVar4 + back->dr * dVar5);
    out->r = (uint)bVar2;
    bVar2 = sRGB((double)in->g * dVar4 + back->dg * dVar5);
    out->g = (uint)bVar2;
    bVar2 = sRGB((double)in->b * dVar4 + dVar5 * back->db);
    uVar3 = (uint)bVar2;
  }
  out->b = uVar3;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16c(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}